

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O3

XXH_errorcode
XXH3_generateSecret(void *secretBuffer,size_t secretSize,void *customSeed,size_t customSeedSize)

{
  XXH_errorcode XVar1;
  ulong uVar2;
  size_t pos;
  ulong uVar3;
  XXH64_hash_t seed64;
  ulong *puVar4;
  xxh_u8 *__src;
  XXH128_hash_t XVar5;
  XXH128_canonical_t scrambler;
  ulong local_40;
  ulong local_38;
  
  XVar1 = XXH_ERROR;
  if (0x87 < secretSize && secretBuffer != (void *)0x0) {
    __src = (xxh_u8 *)customSeed;
    if (customSeedSize == 0) {
      __src = XXH3_kSecret;
      customSeedSize = 0xc0;
    }
    if (__src != (xxh_u8 *)0x0) {
      uVar3 = 0;
      do {
        uVar2 = secretSize - uVar3;
        if (customSeedSize <= secretSize - uVar3) {
          uVar2 = customSeedSize;
        }
        memcpy((void *)((long)secretBuffer + uVar3),__src,uVar2);
        uVar3 = uVar3 + uVar2;
      } while (uVar3 < secretSize);
      seed64 = 0;
      XVar5 = XXH3_128bits_internal
                        (__src,customSeedSize,0,XXH3_kSecret,0xc0,XXH3_hashLong_128b_withSeed);
      uVar2 = XVar5.high64;
      uVar3 = XVar5.low64;
      local_40 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                 (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                 (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
                 uVar2 << 0x38;
      local_38 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                 (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                 (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 |
                 uVar3 << 0x38;
      puVar4 = (ulong *)((long)secretBuffer + 8);
      do {
        XVar5 = XXH3_128bits_internal
                          (&local_40,0x10,seed64,XXH3_kSecret,0xc0,XXH3_hashLong_128b_withSeed);
        puVar4[-1] = puVar4[-1] ^ XVar5.low64;
        *puVar4 = *puVar4 ^ XVar5.high64;
        seed64 = seed64 + 1;
        puVar4 = puVar4 + 2;
      } while (secretSize >> 4 != seed64);
      puVar4 = (ulong *)((long)secretBuffer + (secretSize - 0x10));
      *puVar4 = *puVar4 ^ (local_38 >> 0x38 | (local_38 & 0xff000000000000) >> 0x28 |
                           (local_38 & 0xff0000000000) >> 0x18 | (local_38 & 0xff00000000) >> 8 |
                           (local_38 & 0xff000000) << 8 | (local_38 & 0xff0000) << 0x18 |
                           (local_38 & 0xff00) << 0x28 | local_38 << 0x38);
      puVar4 = (ulong *)((long)secretBuffer + (secretSize - 8));
      *puVar4 = *puVar4 ^ (local_40 >> 0x38 | (local_40 & 0xff000000000000) >> 0x28 |
                           (local_40 & 0xff0000000000) >> 0x18 | (local_40 & 0xff00000000) >> 8 |
                           (local_40 & 0xff000000) << 8 | (local_40 & 0xff0000) << 0x18 |
                           (local_40 & 0xff00) << 0x28 | local_40 << 0x38);
      XVar1 = XXH_OK;
    }
  }
  return XVar1;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode
XXH3_generateSecret(XXH_NOESCAPE void* secretBuffer, size_t secretSize, XXH_NOESCAPE const void* customSeed, size_t customSeedSize)
{
#if (XXH_DEBUGLEVEL >= 1)
    XXH_ASSERT(secretBuffer != NULL);
    XXH_ASSERT(secretSize >= XXH3_SECRET_SIZE_MIN);
#else
    /* production mode, assert() are disabled */
    if (secretBuffer == NULL) return XXH_ERROR;
    if (secretSize < XXH3_SECRET_SIZE_MIN) return XXH_ERROR;
#endif

    if (customSeedSize == 0) {
        customSeed = XXH3_kSecret;
        customSeedSize = XXH_SECRET_DEFAULT_SIZE;
    }
#if (XXH_DEBUGLEVEL >= 1)
    XXH_ASSERT(customSeed != NULL);
#else
    if (customSeed == NULL) return XXH_ERROR;
#endif

    /* Fill secretBuffer with a copy of customSeed - repeat as needed */
    {   size_t pos = 0;
        while (pos < secretSize) {
            size_t const toCopy = XXH_MIN((secretSize - pos), customSeedSize);
            memcpy((char*)secretBuffer + pos, customSeed, toCopy);
            pos += toCopy;
    }   }

    {   size_t const nbSeg16 = secretSize / 16;
        size_t n;
        XXH128_canonical_t scrambler;
        XXH128_canonicalFromHash(&scrambler, XXH128(customSeed, customSeedSize, 0));
        for (n=0; n<nbSeg16; n++) {
            XXH128_hash_t const h128 = XXH128(&scrambler, sizeof(scrambler), n);
            XXH3_combine16((char*)secretBuffer + n*16, h128);
        }
        /* last segment */
        XXH3_combine16((char*)secretBuffer + secretSize - 16, XXH128_hashFromCanonical(&scrambler));
    }
    return XXH_OK;
}